

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::MinMaxNOperation::
Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
          (MinMaxNOperation *this,Vector *state_vector,AggregateInputData *param_2,Vector *result,
          idx_t count,idx_t offset)

{
  ulong uVar1;
  BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan> *this_00;
  idx_t iVar2;
  ArenaAllocator *this_01;
  byte bVar3;
  FunctionData *pFVar4;
  ArenaAllocator *pAVar5;
  Allocator *size;
  Vector *pVVar6;
  STORAGE_TYPE *pSVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  idx_t i;
  char **ppcVar11;
  long lVar12;
  OrderModifiers modifiers;
  ulong uVar13;
  string_t sort_key;
  UnifiedVectorFormat state_format;
  FunctionData *local_b8;
  ArenaAllocator *pAStack_b0;
  Vector *local_a8;
  AggregateInputData *local_a0;
  ArenaAllocator *local_98;
  data_ptr_t local_90;
  idx_t local_88;
  unsigned_long local_80;
  UnifiedVectorFormat local_78;
  
  modifiers = SUB82(offset,0);
  local_88 = count;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)result,&local_78);
  FlatVector::VerifyFlatVector((Vector *)param_2);
  size = (Allocator *)ListVector::GetListSize((Vector *)param_2);
  if (result == (Vector *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    uVar10 = 0;
    do {
      uVar13 = uVar10;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)(local_78.sel)->sel_vector[uVar10];
      }
      lVar12 = lVar12 + *(long *)(*(long *)(local_78.data + uVar13 * 8) + 0x10);
      uVar10 = uVar10 + 1;
    } while (result != (Vector *)uVar10);
  }
  local_90 = local_78.data;
  ListVector::Reserve((Vector *)param_2,(long)&size->allocate_function + lVar12);
  local_98 = param_2[1].allocator;
  pVVar6 = ListVector::GetEntry((Vector *)param_2);
  if (result != (Vector *)0x0) {
    local_a0 = param_2 + 2;
    uVar10 = 0;
    local_a8 = result;
    do {
      uVar13 = uVar10;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)(local_78.sel)->sel_vector[uVar10];
      }
      uVar1 = uVar10 + local_88;
      this_00 = *(BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan> **)
                 (local_90 + uVar13 * 8);
      if (((char)this_00[1].capacity == '\x01') && (iVar2 = this_00->size, iVar2 != 0)) {
        (&local_98->allocator)[uVar1 * 2] = size;
        (&local_98->initial_capacity)[uVar1 * 2] = iVar2;
        pSVar7 = BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan>::
                 SortAndGetHeap(this_00);
        if (this_00->size != 0) {
          ppcVar11 = &(pSVar7->second).value.value.pointer.ptr;
          uVar13 = 0;
          do {
            sort_key.value.pointer.ptr = (char *)pVVar6;
            sort_key.value._0_8_ = *ppcVar11;
            CreateSortKeyHelpers::DecodeSortKey
                      (*(CreateSortKeyHelpers **)(ppcVar11 + -1),sort_key,
                       (Vector *)((long)&size->allocate_function + uVar13),0x302,modifiers);
            uVar13 = uVar13 + 1;
            ppcVar11 = ppcVar11 + 8;
          } while (uVar13 < this_00->size);
          size = (Allocator *)((long)&size->allocate_function + uVar13);
          result = local_a8;
        }
      }
      else {
        _Var9._M_head_impl = *(unsigned_long **)&param_2[1].combine_type;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_80 = *(unsigned_long *)&param_2[2].combine_type;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          pAVar5 = pAStack_b0;
          pFVar4 = local_b8;
          local_b8 = (FunctionData *)0x0;
          pAStack_b0 = (ArenaAllocator *)0x0;
          this_01 = param_2[2].allocator;
          param_2[2].bind_data.ptr = pFVar4;
          param_2[2].allocator = pAVar5;
          if ((this_01 != (ArenaAllocator *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
             pAStack_b0 != (ArenaAllocator *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAStack_b0);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              local_a0);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)&param_2[1].combine_type = _Var9._M_head_impl;
        }
        bVar3 = (byte)uVar1 & 0x3f;
        _Var9._M_head_impl[uVar1 >> 6] =
             _Var9._M_head_impl[uVar1 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar10 = uVar10 + 1;
    } while ((Vector *)uVar10 != result);
  }
  ListVector::SetListSize((Vector *)param_2,(idx_t)size);
  Vector::Verify((Vector *)param_2,(idx_t)result);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}